

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

void ext_defs(GlobalVars *gv,FILE *f,LinkedSection *sec,uint8_t bind,uint8_t stype,uint32_t xdeftype
             )

{
  Symbol *pSVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  Symbol *sym;
  char *__s;
  
  bVar2 = false;
  pSVar1 = (Symbol *)(sec->symbols).first;
  do {
    while( true ) {
      do {
        do {
          sym = pSVar1;
          pSVar1 = (Symbol *)(sym->n).next;
          if (pSVar1 == (Symbol *)0x0) {
            return;
          }
        } while (((sym->type != stype) || (sym->bind != bind)) || (2 < sym->info));
        remnode(&sym->n);
        bVar3 = discard_symbol(gv,sym);
      } while (bVar3 != 0);
      if (xdeftype != 0x100) break;
      if ((stype == '\x03') && ((sym->flags & 2) == 0)) {
        error(0x5d,fff_amigahunk.tname,sym->name);
      }
    }
    if (bVar2) {
      if (xdeftype != 0) goto LAB_00117889;
LAB_001178ae:
      __s = sym->name;
      sVar5 = strlen(__s);
      if (sVar5 < 0x7d) goto LAB_001178e1;
      fwrite32be(f,0x1f);
      fwritex(f,sym->name,0x7c);
    }
    else {
      if (xdeftype == 0) {
        if (symhunk == '\0') {
          symhunk = '\x01';
          fwrite32be(f,0x3f0);
        }
        goto LAB_001178ae;
      }
      if (exthunk == '\0') {
        exthunk = '\x01';
        fwrite32be(f,0x3ef);
      }
LAB_00117889:
      __s = sym->name;
LAB_001178e1:
      uVar4 = strlen32(__s);
      fwrite32be(f,uVar4 | xdeftype << 0x18);
      hunk_name(f,sym->name);
    }
    fwrite32be(f,(uint32_t)sym->value);
    bVar2 = true;
  } while( true );
}

Assistant:

static void ext_defs(struct GlobalVars *gv,FILE *f,struct LinkedSection *sec,
                     uint8_t bind,uint8_t stype,uint32_t xdeftype)
{
  struct Symbol *nextsym,*sym=(struct Symbol *)sec->symbols.first;
  bool xdefs = FALSE;

  while (nextsym = (struct Symbol *)sym->n.next) {
    if (sym->type==stype && sym->bind==bind && sym->info<=SYMI_FUNC) {
      remnode(&sym->n);

      if (!discard_symbol(gv,sym)) {
        if (xdeftype != EXT_IGNORE) {
          if (!xdefs) {
            xdefs = TRUE;
            if (xdeftype == EXT_SYMB) {
              if (!symhunk) {
                symhunk = TRUE;
                fwrite32be(f,HUNK_SYMBOL);
              }
            }
            else {
              if (!exthunk) {
                exthunk = TRUE;
                fwrite32be(f,HUNK_EXT);
              }
            }
          }
          /* generate xdef or symbol table entry */
          if (xdeftype==EXT_SYMB && strlen(sym->name)>124) {
            /* LoadSeg<=V40 doesn't allow more than 31 longwords per symbol,
               and will respond with "bad loadfile hunk" otherwise -
               so just strip the rest! */
            fwrite32be(f,(xdeftype << 24) | 31);
            fwritex(f,sym->name,124);
          }
          else {
            fwrite32be(f,(xdeftype << 24) | strlen32(sym->name));
            hunk_name(f,sym->name);           /* write symbol's name */
          }
          fwrite32be(f,(uint32_t)sym->value);  /* ... and its value */
        }

        else { /* EXT_IGNORE */
          if (stype==SYM_COMMON && !(sym->flags & SYMF_REFERENCED))
            /* Warning: unreferenced common symbol will disappear! */
            error(93,fff_amigahunk.tname,sym->name);
        }
      }
    }
    sym = nextsym;
  }
}